

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::FunctionDeclarationSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((kind == FunctionDeclaration) || (kind == TaskDeclaration)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool FunctionDeclarationSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::FunctionDeclaration:
        case SyntaxKind::TaskDeclaration:
            return true;
        default:
            return false;
    }
}